

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereBoxCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btSphereBoxCollisionAlgorithm::btSphereBoxCollisionAlgorithm
          (btSphereBoxCollisionAlgorithm *this,btPersistentManifold *mf,
          btCollisionAlgorithmConstructionInfo *ci,btCollisionObjectWrapper *col0Wrap,
          btCollisionObjectWrapper *col1Wrap,bool isSwapped)

{
  btDispatcher *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  btCollisionObjectWrapper *pbVar3;
  
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            (&this->super_btActivatingCollisionAlgorithm,ci,col0Wrap,col1Wrap);
  (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm._vptr_btCollisionAlgorithm
       = (_func_int **)&PTR__btSphereBoxCollisionAlgorithm_001edb10;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  this->m_isSwapped = isSwapped;
  if (mf == (btPersistentManifold *)0x0) {
    pbVar3 = col0Wrap;
    if (isSwapped) {
      pbVar3 = col1Wrap;
      col1Wrap = col0Wrap;
    }
    pbVar1 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
    iVar2 = (*pbVar1->_vptr_btDispatcher[6])
                      (pbVar1,pbVar3->m_collisionObject,col1Wrap->m_collisionObject);
    if ((char)iVar2 != '\0') {
      pbVar1 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
      iVar2 = (*pbVar1->_vptr_btDispatcher[3])
                        (pbVar1,pbVar3->m_collisionObject,col1Wrap->m_collisionObject);
      this->m_manifoldPtr = (btPersistentManifold *)CONCAT44(extraout_var,iVar2);
      this->m_ownManifold = true;
    }
  }
  return;
}

Assistant:

btSphereBoxCollisionAlgorithm::btSphereBoxCollisionAlgorithm(btPersistentManifold* mf,const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* col0Wrap,const btCollisionObjectWrapper* col1Wrap, bool isSwapped)
: btActivatingCollisionAlgorithm(ci,col0Wrap,col1Wrap),
m_ownManifold(false),
m_manifoldPtr(mf),
m_isSwapped(isSwapped)
{
	const btCollisionObjectWrapper* sphereObjWrap = m_isSwapped? col1Wrap : col0Wrap;
	const btCollisionObjectWrapper* boxObjWrap = m_isSwapped? col0Wrap : col1Wrap;
	
	if (!m_manifoldPtr && m_dispatcher->needsCollision(sphereObjWrap->getCollisionObject(),boxObjWrap->getCollisionObject()))
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(sphereObjWrap->getCollisionObject(),boxObjWrap->getCollisionObject());
		m_ownManifold = true;
	}
}